

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# egluDefs.cpp
# Opt level: O1

void eglu::checkError(deUint32 err,char *message,char *file,int line)

{
  ResourceError *this;
  size_t sVar1;
  ostringstream desc;
  Enum<int,_2UL> local_1c0 [2];
  ostringstream local_1a0 [376];
  
  if (err == 0x3000) {
    return;
  }
  std::__cxx11::ostringstream::ostringstream(local_1a0);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0,"Got ",4);
  local_1c0[0].m_getName = getErrorName;
  local_1c0[0].m_value = err;
  tcu::Format::Enum<int,_2UL>::toStream(local_1c0,(ostream *)local_1a0);
  if (message != (char *)0x0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0,": ",2);
    sVar1 = strlen(message);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0,message,sVar1);
  }
  this = (ResourceError *)__cxa_allocate_exception(0x38);
  if (err == 0x3003) {
    std::__cxx11::stringbuf::str();
    tcu::ResourceError::ResourceError(this,(char *)local_1c0[0].m_getName,(char *)0x0,file,line);
    *(undefined ***)&(this->super_TestException).super_Exception = &PTR__Exception_00d50780;
    __cxa_throw(this,&BadAllocError::typeinfo,tcu::Exception::~Exception);
  }
  std::__cxx11::stringbuf::str();
  tcu::TestError::TestError((TestError *)this,(char *)local_1c0[0].m_getName,(char *)0x0,file,line);
  *(undefined ***)&(this->super_TestException).super_Exception = &PTR__Exception_00d50750;
  *(deUint32 *)&(this->super_TestException).field_0x34 = err;
  __cxa_throw(this,&Error::typeinfo,tcu::Exception::~Exception);
}

Assistant:

void checkError (deUint32 err, const char* message, const char* file, int line)
{
	if (err != EGL_SUCCESS)
	{
		std::ostringstream desc;
		desc << "Got " << eglu::getErrorStr(err);
		if (message)
			desc << ": " << message;

		if (err == EGL_BAD_ALLOC)
			throw BadAllocError(desc.str().c_str(), DE_NULL, file, line);
		else
			throw Error(err, desc.str().c_str(), DE_NULL, file, line);
	}
}